

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

RandomUniformStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_randomuniformstatic
          (NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  RandomUniformStaticLayerParams *pRVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_randomuniformstatic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_randomuniformstatic(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pRVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::RandomUniformStaticLayerParams>(arena);
    (this->layer_).randomuniformstatic_ = pRVar2;
  }
  return (RandomUniformStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomUniformStaticLayerParams* NeuralNetworkLayer::_internal_mutable_randomuniformstatic() {
  if (!_internal_has_randomuniformstatic()) {
    clear_layer();
    set_has_randomuniformstatic();
    layer_.randomuniformstatic_ = CreateMaybeMessage< ::CoreML::Specification::RandomUniformStaticLayerParams >(GetArenaForAllocation());
  }
  return layer_.randomuniformstatic_;
}